

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

Symbol * __thiscall
slang::ast::anon_unknown_0::NonAnsiPortListBuilder::createPort
          (NonAnsiPortListBuilder *this,ExplicitNonAnsiPortSyntax *syntax)

{
  SyntaxNode *in_RSI;
  PortSymbol *port;
  SourceLocation loc;
  string_view name;
  PortReferenceSyntax *in_stack_000000f8;
  NonAnsiPortListBuilder *in_stack_00000100;
  SourceLocation in_stack_00000108;
  undefined1 in_stack_00000110 [16];
  PortConcatenationSyntax *in_stack_000001c0;
  NonAnsiPortListBuilder *in_stack_000001c8;
  SourceLocation in_stack_000001d0;
  undefined1 in_stack_000001d8 [16];
  Token *in_stack_ffffffffffffffa0;
  bool *in_stack_ffffffffffffffa8;
  SourceLocation *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  uint7 in_stack_ffffffffffffffc0;
  PortSymbol *local_8;
  
  parsing::Token::valueText(in_stack_ffffffffffffffa0);
  parsing::Token::location((Token *)&in_RSI[1].previewNode);
  if (*(long *)(in_RSI + 3) == 0) {
    local_8 = BumpAllocator::
              emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool>
                        ((BumpAllocator *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                         ,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_8->direction = In;
    Symbol::setSyntax(&local_8->super_Symbol,in_RSI);
    local_8->isNullPort = true;
  }
  else if (**(int **)(in_RSI + 3) == 0x16e) {
    slang::syntax::SyntaxNode::as<slang::syntax::PortConcatenationSyntax>
              (*(SyntaxNode **)(in_RSI + 3));
    local_8 = (PortSymbol *)
              createPort(in_stack_000001c8,(string_view)in_stack_000001d8,in_stack_000001d0,
                         in_stack_000001c0);
  }
  else {
    slang::syntax::SyntaxNode::as<slang::syntax::PortReferenceSyntax>(*(SyntaxNode **)(in_RSI + 3));
    local_8 = (PortSymbol *)
              createPort(in_stack_00000100,(string_view)in_stack_00000110,in_stack_00000108,
                         in_stack_000000f8);
  }
  return &local_8->super_Symbol;
}

Assistant:

Symbol* createPort(const ExplicitNonAnsiPortSyntax& syntax) {
        auto name = syntax.name.valueText();
        auto loc = syntax.name.location();

        if (!syntax.expr) {
            auto port = comp.emplace<PortSymbol>(name, loc, /* isAnsiPort */ false);
            port->direction = ArgumentDirection::In;
            port->setSyntax(syntax);
            port->isNullPort = true;
            return port;
        }

        switch (syntax.expr->kind) {
            case SyntaxKind::PortReference:
                return &createPort(name, loc, syntax.expr->as<PortReferenceSyntax>());
            case SyntaxKind::PortConcatenation:
                return &createPort(name, loc, syntax.expr->as<PortConcatenationSyntax>());
            default:
                SLANG_UNREACHABLE;
        }
    }